

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTree.cpp
# Opt level: O1

void __thiscall Indexing::CodeTree::SearchStruct::destroy(SearchStruct *this)

{
  void *pvVar1;
  pointer ppCVar2;
  
  if ((this->kind != GROUND_TERM_STRUCT) && (this->kind != FN_STRUCT)) {
    return;
  }
  pvVar1 = (void *)this[1].landingOp._content;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)&this[1].kind - (long)pvVar1);
  }
  ppCVar2 = (this->targets).
            super__Vector_base<Indexing::CodeTree::CodeOp_*,_std::allocator<Indexing::CodeTree::CodeOp_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppCVar2 != (pointer)0x0) {
    operator_delete(ppCVar2,(long)(this->targets).
                                  super__Vector_base<Indexing::CodeTree::CodeOp_*,_std::allocator<Indexing::CodeTree::CodeOp_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppCVar2
                   );
  }
  operator_delete(this,0x48);
  return;
}

Assistant:

void CodeTree::SearchStruct::destroy()
{
  switch(kind) {
  case FN_STRUCT:
    delete static_cast<FnSearchStruct*>(this);
    break;
  case GROUND_TERM_STRUCT:
    delete static_cast<GroundTermSearchStruct*>(this);
    break;
  }
}